

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

void al_print(LogLevel level,FILE *logfile,char *fmt,...)

{
  int iVar1;
  char *__s;
  size_type __maxlen;
  vector<char,_al::allocator<char,_1UL>_> *in_RCX;
  char *in_RDX;
  FILE *in_RSI;
  int in_EDI;
  int msglen;
  va_list args2;
  va_list args;
  char *str;
  char stcmsg [256];
  vector<char> dynmsg;
  bool local_249;
  undefined1 local_248 [8];
  vector<char,_al::allocator<char,_1UL>_> *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  undefined8 local_178;
  undefined1 *puStack_170;
  undefined1 *local_168;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined1 *puStack_150;
  undefined1 *local_148;
  char *local_140;
  char local_138 [264];
  vector<char,_al::allocator<char,_1UL>_> local_30;
  char *local_18;
  FILE *local_10;
  int local_4;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::vector<char,_al::allocator<char,_1UL>_>::vector
            ((vector<char,_al::allocator<char,_1UL>_> *)0x1f1cd2);
  local_140 = local_138;
  local_168 = local_248;
  puStack_170 = &stack0x00000008;
  uStack_154 = 0x30;
  local_158 = 0x18;
  local_178 = 0x3000000018;
  puStack_150 = puStack_170;
  local_148 = local_168;
  iVar1 = vsnprintf(local_140,0x100,local_18,&local_158);
  local_249 = 0xff < iVar1;
  if (local_249) {
    std::vector<char,_al::allocator<char,_1UL>_>::resize(in_RCX,in_stack_fffffffffffffdc8);
    __s = std::vector<char,_al::allocator<char,_1UL>_>::data
                    ((vector<char,_al::allocator<char,_1UL>_> *)0x1f1db0);
    local_140 = __s;
    __maxlen = std::vector<char,_al::allocator<char,_1UL>_>::size(&local_30);
    vsnprintf(__s,__maxlen,local_18,&local_178);
  }
  if (local_4 <= (int)gLogLevel) {
    fputs(local_140,local_10);
    fflush(local_10);
  }
  std::vector<char,_al::allocator<char,_1UL>_>::~vector(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void al_print(LogLevel level, FILE *logfile, const char *fmt, ...)
{
    al::vector<char> dynmsg;
    char stcmsg[256];
    char *str{stcmsg};

    va_list args, args2;
    va_start(args, fmt);
    va_copy(args2, args);
    int msglen{std::vsnprintf(str, sizeof(stcmsg), fmt, args)};
    if UNLIKELY(msglen >= 0 && static_cast<size_t>(msglen) >= sizeof(stcmsg))
    {
        dynmsg.resize(static_cast<size_t>(msglen) + 1u);
        str = dynmsg.data();
        msglen = std::vsnprintf(str, dynmsg.size(), fmt, args2);
    }